

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O0

Pubkey * cfd::core::ConvertSecpPubkey
                   (Pubkey *__return_storage_ptr__,secp256k1_pubkey_conflict *pubkey)

{
  int iVar1;
  uchar *output;
  undefined8 uVar2;
  allocator_type *in_stack_ffffffffffffff30;
  string *message;
  size_type in_stack_ffffffffffffff38;
  secp256k1_context *ctx_00;
  CfdError error_code;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  ByteData local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [36];
  int local_5c;
  size_type sStack_58;
  int ret;
  size_t result_bytes_size;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> result_bytes;
  secp256k1_context_struct *ctx;
  secp256k1_pubkey_conflict *pubkey_local;
  
  result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wally_get_secp_context();
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x49bc9d);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),in_stack_ffffffffffffff38
             ,in_stack_ffffffffffffff30);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x49bcbd);
  message = (string *)local_38;
  sStack_58 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
  ctx_00 = (secp256k1_context *)
           result_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  output = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x49bce8);
  iVar1 = secp256k1_ec_pubkey_serialize(ctx_00,output,&stack0xffffffffffffffa8,pubkey,0x102);
  error_code = (CfdError)((ulong)ctx_00 >> 0x20);
  local_5c = iVar1;
  if ((iVar1 == 1) && (sStack_58 == 0x21)) {
    ByteData::ByteData(&local_a0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    Pubkey::Pubkey(__return_storage_ptr__,&local_a0);
    ByteData::~ByteData((ByteData *)0x49be3f);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)message);
    return __return_storage_ptr__;
  }
  local_82 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_80,"Secp256k1 serialize exception",&local_81);
  CfdException::CfdException
            ((CfdException *)CONCAT44(iVar1,in_stack_ffffffffffffff40),error_code,message);
  local_82 = 0;
  __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey ConvertSecpPubkey(const secp256k1_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(Pubkey::kCompressedPubkeySize);
  size_t result_bytes_size = result_bytes.size();
  int ret = secp256k1_ec_pubkey_serialize(
      ctx, result_bytes.data(), &result_bytes_size, &pubkey,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1 || (result_bytes_size != Pubkey::kCompressedPubkeySize)) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return Pubkey(result_bytes);
}